

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-xtra.h
# Opt level: O0

Expression eq(Expression *expr,float value,float epsilon)

{
  Expression *in_RSI;
  ComputationGraph *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  Expression EVar1;
  Expression *in_stack_ffffffffffffff88;
  Expression local_68;
  Expression local_58;
  Expression local_48;
  Expression local_38;
  Expression local_28;
  float local_18;
  float local_14;
  Expression *local_10;
  
  local_18 = in_XMM1_Da;
  local_14 = in_XMM0_Da;
  local_10 = in_RSI;
  dynet::expr::operator-(&local_48,in_XMM0_Da - in_XMM1_Da);
  dynet::expr::rectify(&local_38);
  dynet::expr::operator-((expr *)&stack0xffffffffffffff88,local_10);
  dynet::expr::operator+(&local_68,local_14 + local_18);
  dynet::expr::rectify(&local_58);
  dynet::expr::min(&local_28,&local_38);
  EVar1 = dynet::expr::operator/(in_stack_ffffffffffffff88,(float)((ulong)in_RDI >> 0x20));
  EVar1.pg = in_RDI;
  return EVar1;
}

Assistant:

Expression eq(const Expression &expr, float value, float epsilon=0.1) 
{
    return min(rectify(expr - (value - epsilon)), rectify(-expr + (value + epsilon))) / epsilon; 
}